

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_playback_callback(JoypadButtons *joyp,void *user_data)

{
  Ticks ticks;
  ulong uVar1;
  ulong *puVar2;
  JoypadState *pJVar3;
  JoypadStateIter JVar4;
  JoypadStateIter JVar5;
  JoypadButtons local_48;
  
  ticks = emulator_get_ticks(*user_data);
  uVar1 = **(ulong **)((long)user_data + 0x18);
  if (ticks < uVar1) {
    JVar4 = joypad_find_state(*(JoypadBuffer **)((long)user_data + 8),ticks);
    *(JoypadStateIter *)((long)user_data + 0x10) = JVar4;
    JVar5 = joypad_get_next_state(JVar4);
    *(JoypadStateIter *)((long)user_data + 0x20) = JVar5;
    uVar1 = (JVar4.state)->ticks;
  }
  if (ticks < uVar1) {
    __assert_fail("ticks >= playback->current.state->ticks",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0x10f,"void joypad_playback_callback(struct JoypadButtons *, void *)");
  }
  pJVar3 = *(JoypadState **)((long)user_data + 0x28);
  while (pJVar3 != (JoypadState *)0x0) {
    puVar2 = *(ulong **)((long)user_data + 0x18);
    if (ticks < pJVar3->ticks) goto LAB_00192383;
    if (pJVar3->ticks < *puVar2) {
      __assert_fail("playback->next.state->ticks >= playback->current.state->ticks",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                    0x112,"void joypad_playback_callback(struct JoypadButtons *, void *)");
    }
    *(undefined8 *)((long)user_data + 0x10) = *(undefined8 *)((long)user_data + 0x20);
    *(undefined8 *)((long)user_data + 0x18) = *(undefined8 *)((long)user_data + 0x28);
    JVar4.state = pJVar3;
    JVar4.chunk = *(JoypadChunk **)((long)user_data + 0x20);
    JVar4 = joypad_get_next_state(JVar4);
    *(JoypadStateIter *)((long)user_data + 0x20) = JVar4;
    pJVar3 = JVar4.state;
  }
  puVar2 = *(ulong **)((long)user_data + 0x18);
LAB_00192383:
  joypad_unpack_buttons(&local_48,(u8)puVar2[1]);
  joyp->start = local_48.start;
  joyp->select = local_48.select;
  joyp->B = local_48.B;
  joyp->A = local_48.A;
  joyp->down = local_48.down;
  joyp->up = local_48.up;
  joyp->left = local_48.left;
  joyp->right = local_48.right;
  return;
}

Assistant:

static void joypad_playback_callback(struct JoypadButtons* joyp,
                                     void* user_data) {
  Bool changed = FALSE;
  JoypadPlayback* playback = user_data;
  Ticks ticks = emulator_get_ticks(playback->e);
  if (ticks < playback->current.state->ticks) {
    playback->current = joypad_find_state(playback->buffer, ticks);
    playback->next = joypad_get_next_state(playback->current);
    changed = TRUE;
  }

  assert(ticks >= playback->current.state->ticks);

  while (playback->next.state && playback->next.state->ticks <= ticks) {
    assert(playback->next.state->ticks >= playback->current.state->ticks);
    playback->current = playback->next;
    playback->next = joypad_get_next_state(playback->next);
    changed = TRUE;
  }

#if DEBUG_JOYPAD_BUTTONS
  if (changed) {
    print_joypad_buttons(
        playback->current.state->ticks,
        joypad_unpack_buttons(playback->current.state->buttons));
  }
#else
  (void)changed;
#endif

  *joyp = joypad_unpack_buttons(playback->current.state->buttons);
}